

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O2

void __thiscall
miniros::TopicManager::getBusInfoCallback
          (TopicManager *this,XmlRpcValue *params,XmlRpcValue *result)

{
  XmlRpcValue *pXVar1;
  allocator<char> local_49;
  XmlRpcValue response;
  XmlRpcValue local_28;
  
  response._type = TypeBoolean;
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,0);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&response);
  std::__cxx11::string::string<std::allocator<char>>((string *)&response,"",&local_49);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28,(string *)&response);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,1);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_28);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_28);
  std::__cxx11::string::~string((string *)&response);
  response._type = TypeInvalid;
  response._value.asDouble = 0.0;
  getBusInfo(this,&response);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&response);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&response);
  return;
}

Assistant:

void TopicManager::getBusInfoCallback(const XmlRpc::XmlRpcValue& params, XmlRpc::XmlRpcValue& result)
{
  (void)params;
  result[0] = 1;
  result[1] = std::string("");
  XmlRpcValue response;
  getBusInfo(response);
  result[2] = response;
}